

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_WeaponReady(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  player_t *ppVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  ushort uVar8;
  uint uVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052de3b;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar9 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (self->super_DThinker).super_DObject.Class;
      bVar11 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar9 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar11);
      if (pPVar7 != pPVar4 && !bVar11) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052de3b;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052de10;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar10,uVar9,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar11) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar11 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052de3b;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar9 = 0;
      if (3 < numparam) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          uVar9 = param[3].field_0.i;
        }
        else {
          uVar9 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x2e8,
                          "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
      }
      if ((self != (AActor *)0x0) && (ppVar3 = self->player, ppVar3 != (player_t *)0x0)) {
        uVar8 = ppVar3->WeaponState & 0xff7f;
        if ((uVar9 & 2) == 0) {
          uVar8 = ppVar3->WeaponState | 0x88;
        }
        ppVar3->WeaponState = uVar8;
      }
      if ((~uVar9 & 0xc) != 0) {
        DoReadyWeaponToFire(self,(uVar9 & 4) == 0,(uVar9 & 8) == 0);
      }
      if ((uVar9 & 1) == 0) {
        DoReadyWeaponToBob(self);
      }
      DoReadyWeaponToGeneric(self,uVar9);
      if ((self != (AActor *)0x0) && (ppVar3 = self->player, ppVar3 != (player_t *)0x0)) {
        uVar8 = ppVar3->WeaponState & 0xffef;
        if ((uVar9 & 0x40) != 0) {
          uVar8 = ppVar3->WeaponState & 0xff6f | 0x10;
        }
        ppVar3->WeaponState = uVar8;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052de10:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052de3b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_WeaponReady)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(flags)	{ flags = 0; }

													DoReadyWeaponToSwitch(self, !(flags & WRF_NoSwitch));
	if ((flags & WRF_NoFire) != WRF_NoFire)			DoReadyWeaponToFire(self, !(flags & WRF_NoPrimary), !(flags & WRF_NoSecondary));
	if (!(flags & WRF_NoBob))						DoReadyWeaponToBob(self);
													DoReadyWeaponToGeneric(self, flags);
	DoReadyWeaponDisableSwitch(self, flags & WRF_DisableSwitch);
	return 0;
}